

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::setKernelArgUSMPointer(CLIntercept *this,cl_kernel kernel,cl_uint arg_index,void *arg)

{
  bool bVar1;
  pointer ppVar2;
  mapped_type *ppvVar3;
  map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
  *in_RCX;
  CArgMemMap *argMemMap;
  void *endPtr;
  void *startPtr;
  iterator iter;
  lock_guard<std::mutex> lock;
  map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
  *in_stack_ffffffffffffff58;
  map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
  *this_00;
  lock_guard<std::mutex> *in_stack_ffffffffffffff60;
  bool local_82;
  bool local_81;
  map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
  *pmVar4;
  _Self local_58;
  _Self local_50 [3];
  _Self local_38;
  undefined4 local_2c;
  map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
  *local_20;
  
  local_20 = in_RCX;
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff60,(mutex_type *)in_stack_ffffffffffffff58);
  bVar1 = std::
          map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
          ::empty((map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
                   *)0x20be95);
  if (bVar1) {
    local_2c = 1;
  }
  else {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
         ::lower_bound(in_stack_ffffffffffffff58,(key_type *)0x20bec1);
    local_50[0]._M_node =
         (_Base_ptr)
         std::
         map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
         ::end(in_stack_ffffffffffffff58);
    bVar1 = std::operator==(&local_38,local_50);
    local_81 = true;
    if (!bVar1) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_void_*const,_unsigned_long>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_void_*const,_unsigned_long>_> *)
                          0x20bf0e);
      local_82 = false;
      if ((map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
           *)ppVar2->first != local_20) {
        local_58._M_node =
             (_Base_ptr)
             std::
             map<const_void_*,_unsigned_long,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
             ::begin(in_stack_ffffffffffffff58);
        local_82 = std::operator!=(&local_38,&local_58);
      }
      local_81 = local_82;
    }
    if (local_81 != false) {
      std::_Rb_tree_iterator<std::pair<const_void_*const,_unsigned_long>_>::operator--
                ((_Rb_tree_iterator<std::pair<const_void_*const,_unsigned_long>_> *)
                 in_stack_ffffffffffffff60);
    }
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_void_*const,_unsigned_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_void_*const,_unsigned_long>_> *)0x20bf92)
    ;
    pmVar4 = (map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
              *)ppVar2->first;
    this_00 = pmVar4;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_void_*const,_unsigned_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_void_*const,_unsigned_long>_> *)0x20bfae)
    ;
    pmVar4 = (map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
              *)((long)&(pmVar4->_M_t)._M_impl.field_0x0 + ppVar2->second);
    if ((this_00 <= local_20) && (local_20 < pmVar4)) {
      std::
      map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
      ::operator[](this_00,(key_type *)pmVar4);
      ppvVar3 = std::
                map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
                ::operator[]((map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
                              *)this_00,(key_type_conflict1 *)pmVar4);
      *ppvVar3 = this_00;
    }
    local_2c = 0;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x20c04a);
  return;
}

Assistant:

void CLIntercept::setKernelArgUSMPointer(
    cl_kernel kernel,
    cl_uint arg_index,
    const void* arg )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    if( m_USMAllocInfoMap.empty() )
    {
        return;
    }

    CUSMAllocInfoMap::iterator iter = m_USMAllocInfoMap.lower_bound( arg );
    if( iter == m_USMAllocInfoMap.end() || (iter->first != arg && iter != m_USMAllocInfoMap.begin()) )
    {
        // Go to the previous iterator.
        --iter;
    }

    const void* startPtr = iter->first;
    const void* endPtr = (const char*)startPtr + iter->second;
    if( arg >= startPtr && arg < endPtr )
    {
        CArgMemMap& argMemMap = m_KernelArgMemMap[ kernel ];
        argMemMap[ arg_index ] = startPtr;
    }
}